

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listenable_impl.hpp
# Opt level: O3

int __thiscall
wigwag::detail::
listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
::connect(listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
          *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  undefined4 in_register_00000034;
  long lVar2;
  
  lVar2 = CONCAT44(in_register_00000034,__fd);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(lVar2 + 0x68));
  if (iVar1 == 0) {
    if (((__len & 1) == 0) && (*(long *)(lVar2 + 0xa0) != 0)) {
      (**(code **)(lVar2 + 0xa8))(lVar2 + 0x90,__addr);
    }
    listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
    ::create_node<std::function<void()>>
              ((listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
                *)this,__fd,(function<void_()> *)(ulong)__len);
    pthread_mutex_unlock((pthread_mutex_t *)(lVar2 + 0x68));
    return (int)this;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

token connect(handler_type handler, handler_attributes attributes)
        {
            get_lock_primitive().lock_nonrecursive();
            auto sg = detail::at_scope_exit([&] { get_lock_primitive().unlock_nonrecursive(); } );

            if (!contains_flag(attributes, handler_attributes::suppress_populator) && get_handler_processor().has_populate_state())
                get_exception_handler().handle_exceptions([&] { get_handler_processor().populate_state(handler); });

            return create_node(attributes, std::move(handler));
        }